

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase395::run(TestCase395 *this)

{
  DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>_&,_kj::Quantity<long,_kj::_::NanosecondLabel>_>
  *params_1;
  MonotonicClock *pMVar1;
  long lVar2;
  int iVar3;
  Quantity<long,_kj::_::NanosecondLabel> t;
  PredicateImpl_conflict1 impl;
  MutexGuarded<unsigned_int> value;
  long local_a0 [2];
  DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>_&,_kj::Quantity<long,_kj::_::NanosecondLabel>_>
  local_90;
  Mutex *local_68;
  Mutex *local_60;
  char *local_58;
  Mutex local_50;
  char local_38 [8];
  
  pMVar1 = systemPreciseMonotonicClock();
  iVar3 = 0x14;
  params_1 = (DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>_&,_kj::Quantity<long,_kj::_::NanosecondLabel>_>
              *)(local_a0 + 2);
  while( true ) {
    _::Mutex::Mutex(&local_50);
    local_38[0] = '{';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    lVar2 = (*(code *)**(undefined8 **)pMVar1)(pMVar1);
    local_90.left =
         (Quantity<long,_kj::_::NanosecondLabel> *)((ulong)local_90.left & 0xffffffffffffff00);
    local_68 = &local_50;
    _::Mutex::lock(&local_50,0,params_1);
    local_90.op.content.ptr = local_38;
    local_90.left = (Quantity<long,_kj::_::NanosecondLabel> *)&PTR_check_00238540;
    local_90.right.value = (long)&local_68;
    local_a0[0] = CONCAT71(local_a0[0]._1_7_,1);
    local_a0[1] = 100000000;
    local_60 = &local_50;
    local_58 = local_90.op.content.ptr;
    _::Mutex::wait(&local_50,params_1);
    if (local_60 != (Mutex *)0x0) {
      _::Mutex::unlock(local_60,EXCLUSIVE,(Waiter *)0x0);
    }
    local_a0[0] = (*(code *)**(undefined8 **)pMVar1)(pMVar1);
    local_a0[0] = local_a0[0] - lVar2;
    local_90.result = 99999999 < local_a0[0];
    local_90.right.value = 100000000;
    local_90.op.content.ptr = " >= ";
    local_90.op.content.size_ = 5;
    local_90.left = (Quantity<long,_kj::_::NanosecondLabel> *)local_a0;
    if ((local_a0[0] < 100000000) && (_::Debug::minSeverity < 3)) {
      _::Debug::
      log<char_const(&)[45],kj::_::DebugComparison<kj::Quantity<long,kj::_::NanosecondLabel>&,kj::Quantity<long,kj::_::NanosecondLabel>>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x1a0,ERROR,"\"failed: expected \" \"t >= 100 * kj::MILLISECONDS\", _kjCondition",
                 (char (*) [45])"failed: expected t >= 100 * kj::MILLISECONDS",params_1);
    }
    lVar2 = local_a0[0];
    _::Mutex::~Mutex(&local_50);
    if (lVar2 < 0x7270e01) break;
    iVar3 = iVar3 + -1;
    if (iVar3 == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                ((Fault *)(local_a0 + 2),
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
                 ,0x1a7,FAILED,(char *)0x0,"\"time not within expected bounds even after retries\"",
                 (char (*) [51])"time not within expected bounds even after retries");
      _::Debug::Fault::fatal((Fault *)(local_a0 + 2));
    }
  }
  return;
}

Assistant:

TEST(Mutex, WhenWithTimeoutPreciseTiming) {
  // Test that MutexGuarded::when() with a timeout sleeps for precisely the right amount of time.

  auto& clock = systemPreciseMonotonicClock();

  for (uint retryCount = 0; retryCount < 20; retryCount++) {
    MutexGuarded<uint> value(123);

    auto start = clock.now();
    uint m = value.when([&value](uint n) {
      // HACK: Reset the value as a way of testing what happens when the waiting thread is woken
      //   up but then finds it's not ready yet.
      value.getWithoutLock() = 123;
      return n == 321;
    }, [](uint& n) {
      return 456;
    }, 100 * kj::MILLISECONDS);

    KJ_EXPECT(m == 456);

    auto t = clock.now() - start;
    KJ_EXPECT(t >= 100 * kj::MILLISECONDS);
    // Provide a large margin of error here because some operating systems (e.g. Windows) can have
    // long timeslices (13ms) and won't schedule more precisely than a timeslice.
    if (t <= 120 * kj::MILLISECONDS) {
      return;
    }
  }
  KJ_FAIL_ASSERT("time not within expected bounds even after retries");
}